

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleInfoMap.h
# Opt level: O3

void __thiscall cbtTriangleInfoMap::cbtTriangleInfoMap(cbtTriangleInfoMap *this)

{
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_ownsMemory = true;
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data = (int *)0x0;
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size = 0;
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity = 0;
  (this->super_cbtInternalTriangleInfoMap).m_next.m_ownsMemory = true;
  (this->super_cbtInternalTriangleInfoMap).m_next.m_data = (int *)0x0;
  (this->super_cbtInternalTriangleInfoMap).m_next.m_size = 0;
  (this->super_cbtInternalTriangleInfoMap).m_next.m_capacity = 0;
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_ownsMemory = true;
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data = (cbtTriangleInfo *)0x0;
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size = 0;
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_capacity = 0;
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_ownsMemory = true;
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data = (cbtHashInt *)0x0;
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size = 0;
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_capacity = 0;
  this->_vptr_cbtTriangleInfoMap = (_func_int **)&PTR__cbtTriangleInfoMap_00b48340;
  this->m_convexEpsilon = 0.0;
  this->m_planarEpsilon = 0.0001;
  this->m_equalVertexThreshold = 9.999999e-09;
  this->m_edgeDistanceThreshold = 0.1;
  this->m_maxEdgeAngleThreshold = 6.2831855;
  this->m_zeroAreaThreshold = 9.999999e-09;
  return;
}

Assistant:

cbtTriangleInfoMap()
	{
		m_convexEpsilon = 0.00f;
		m_planarEpsilon = 0.0001f;
		m_equalVertexThreshold = cbtScalar(0.0001) * cbtScalar(0.0001);
		m_edgeDistanceThreshold = cbtScalar(0.1);
		m_zeroAreaThreshold = cbtScalar(0.0001) * cbtScalar(0.0001);
		m_maxEdgeAngleThreshold = SIMD_2_PI;
	}